

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.c
# Opt level: O2

SqQueue EnQueue2(SqQueue Q,ElementType e)

{
  ulong uVar1;
  SqQueue SVar2;
  
  if ((Q.front + 1) % 100 == Q.front) {
    printf(anon_var_dwarf_9e);
  }
  Q.base[(long)Q._8_8_ >> 0x20] = e;
  uVar1 = (long)(Q.rear + 1) % 100 << 0x20 | Q._8_8_ & 0xffffffff;
  puts(&DAT_00102074);
  SVar2.front = (int)uVar1;
  SVar2.rear = (int)(uVar1 >> 0x20);
  SVar2.base = Q.base;
  return SVar2;
}

Assistant:

SqQueue EnQueue2(SqQueue Q,ElementType e){
    if((Q.front + 1) % MAXQSIZE == Q.front){
        printf("队列已满");
    }
    Q.base[Q.rear] = e;
    Q.rear = (Q.rear + 1) % MAXQSIZE;
    printf("成功插入元素\n");
    return Q;
}